

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrasterizer.cpp
# Opt level: O3

void __thiscall QScanConverter::scanConvert<true>(QScanConverter *this)

{
  int y;
  int iVar1;
  Line **ppLVar2;
  Line *pLVar3;
  bool bVar4;
  int iVar5;
  int x;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  Line *l;
  Line *pLVar9;
  long lVar10;
  int local_48;
  int local_44;
  
  uVar8 = (this->m_lines).siz;
  if (uVar8 != 0) {
    pLVar9 = (this->m_lines).buffer;
    lVar10 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<QScanConverter::Line*,long,__gnu_cxx::__ops::_Iter_comp_iter<QScanConverter::scanConvert<true>()::_lambda(QScanConverter::Line_const&,QScanConverter::Line_const&)_1_>>
              (pLVar9,pLVar9 + uVar8,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<QScanConverter::Line*,__gnu_cxx::__ops::_Iter_comp_iter<QScanConverter::scanConvert<true>()::_lambda(QScanConverter::Line_const&,QScanConverter::Line_const&)_1_>>
              (pLVar9);
    y = ((this->m_lines).buffer)->top;
    if (y <= this->m_bottom) {
      local_44 = 0;
      do {
        lVar10 = (long)local_44;
        if (lVar10 < (this->m_lines).siz) {
          do {
            pLVar9 = (this->m_lines).buffer;
            if (pLVar9[lVar10].top != y) break;
            pLVar9 = pLVar9 + lVar10;
            uVar8 = (this->m_active).siz;
            lVar7 = uVar8 + 1;
            QDataBuffer<QScanConverter::Line_*>::reserve(&this->m_active,lVar7);
            (this->m_active).siz = lVar7;
            uVar6 = (int)lVar7 - 2;
            if (-1 < (int)uVar6) {
              lVar7 = pLVar9->x;
              do {
                uVar6 = (int)uVar8 - 1;
                ppLVar2 = (this->m_active).buffer;
                pLVar3 = ppLVar2[uVar6];
                if (pLVar3->x <= lVar7) goto LAB_00427d20;
                ppLVar2[(ulong)uVar6 + 1] = pLVar3;
                uVar6 = (int)uVar8 - 1;
                uVar8 = (ulong)uVar6;
              } while (0 < (int)uVar6);
              uVar6 = 0xffffffff;
            }
LAB_00427d20:
            (this->m_active).buffer[(long)(int)uVar6 + 1] = pLVar9;
            lVar10 = lVar10 + 1;
          } while (lVar10 < (this->m_lines).siz);
          local_44 = (int)lVar10;
        }
        local_48 = (int)(this->m_active).siz;
        if (0 < local_48) {
          iVar5 = 0;
          uVar6 = 0;
          x = 0;
          do {
            lVar10 = (long)iVar5;
            pLVar9 = (this->m_active).buffer[lVar10];
            iVar1 = *(int *)((long)&pLVar9->x + 2);
            if ((this->m_fillRuleMask & uVar6) != 0) {
              QSpanBuffer::addSpan(this->m_spanBuffer,x,iVar1 - x,y,0xff);
            }
            uVar6 = uVar6 + pLVar9->winding;
            if (pLVar9->bottom == y) {
              local_48 = local_48 + -1;
              lVar7 = (long)local_48;
              if (iVar5 < local_48) {
                do {
                  ppLVar2 = (this->m_active).buffer;
                  ppLVar2[lVar10] = ppLVar2[lVar10 + 1];
                  lVar10 = lVar10 + 1;
                } while (lVar7 != lVar10);
              }
              QDataBuffer<QScanConverter::Line_*>::reserve(&this->m_active,lVar7);
              (this->m_active).siz = lVar7;
              iVar5 = iVar5 + -1;
            }
            iVar5 = iVar5 + 1;
            x = iVar1;
          } while (iVar5 < local_48);
        }
        bVar4 = y < this->m_bottom;
        y = y + 1;
      } while (bVar4);
    }
  }
  (this->m_active).siz = 0;
  return;
}

Assistant:

void QScanConverter::scanConvert()
{
    if (!m_lines.size()) {
        m_active.reset();
        return;
    }
    constexpr auto topOrder = [](const Line &a, const Line &b) {
        return a.top < b.top;
    };
    constexpr auto xOrder = [](const Line *a, const Line *b) {
        return a->x < b->x;
    };

    std::sort(m_lines.data(), m_lines.data() + m_lines.size(), topOrder);
    int line = 0;
    for (int y = m_lines.first().top; y <= m_bottom; ++y) {
        for (; line < m_lines.size() && m_lines.at(line).top == y; ++line) {
            // add node to active list
            if constexpr(AllVertical) {
                QScanConverter::Line *l = &m_lines.at(line);
                m_active.resize(m_active.size() + 1);
                int j;
                for (j = m_active.size() - 2; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            } else {
                m_active << &m_lines.at(line);
            }
        }

        int numActive = m_active.size();
        if constexpr(!AllVertical) {
            // use insertion sort instead of std::sort, as the active edge list is quite small
            // and in the average case already sorted
            for (int i = 1; i < numActive; ++i) {
                QScanConverter::Line *l = m_active.at(i);
                int j;
                for (j = i-1; j >= 0 && xOrder(l, m_active.at(j)); --j)
                    m_active.at(j+1) = m_active.at(j);
                m_active.at(j+1) = l;
            }
        }

        int x = 0;
        int winding = 0;
        for (int i = 0; i < numActive; ++i) {
            QScanConverter::Line *node = m_active.at(i);

            const int current = QScFixedToInt(node->x);
            if (winding & m_fillRuleMask)
                m_spanBuffer->addSpan(x, current - x, y, 0xff);

            x = current;
            winding += node->winding;

            if (node->bottom == y) {
                // remove node from active list
                for (int j = i; j < numActive - 1; ++j)
                    m_active.at(j) = m_active.at(j+1);

                m_active.resize(--numActive);
                --i;
            } else {
                if constexpr(!AllVertical)
                    node->x += node->delta;
            }
        }
    }
    m_active.reset();
}